

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_is_coinbase(wally_tx *tx,size_t *written)

{
  _Bool local_21;
  size_t *written_local;
  wally_tx *tx_local;
  
  if ((tx == (wally_tx *)0x0) || (written == (size_t *)0x0)) {
    tx_local._4_4_ = -2;
  }
  else {
    local_21 = false;
    if (tx->num_inputs == 1) {
      local_21 = is_valid_coinbase_input(tx->inputs);
    }
    *written = (long)(int)(uint)local_21;
    tx_local._4_4_ = 0;
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_is_coinbase(const struct wally_tx *tx, size_t *written)
{
    if (!tx || !written)
        return WALLY_EINVAL;

    *written = tx->num_inputs == 1 && is_valid_coinbase_input(tx->inputs);

    return WALLY_OK;
}